

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O2

IncrementPrecision *
icu_63::number::Precision::constructIncrement
          (IncrementPrecision *__return_storage_ptr__,double increment,int32_t minFrac)

{
  digits_t dVar1;
  
  dVar1 = impl::roundingutils::doubleFractionLength(increment);
  (__return_storage_ptr__->super_Precision).fType = RND_INCREMENT;
  (__return_storage_ptr__->super_Precision).fUnion.increment.fIncrement = increment;
  (__return_storage_ptr__->super_Precision).fUnion.increment.fMinFrac = (digits_t)minFrac;
  (__return_storage_ptr__->super_Precision).fUnion.increment.fMaxFrac = dVar1;
  (__return_storage_ptr__->super_Precision).fRoundingMode = UNUM_FOUND_HALFEVEN;
  return __return_storage_ptr__;
}

Assistant:

IncrementPrecision Precision::constructIncrement(double increment, int32_t minFrac) {
    IncrementSettings settings;
    settings.fIncrement = increment;
    settings.fMinFrac = static_cast<digits_t>(minFrac);
    // One of the few pre-computed quantities:
    // Note: it is possible for minFrac to be more than maxFrac... (misleading)
    settings.fMaxFrac = roundingutils::doubleFractionLength(increment);
    PrecisionUnion union_;
    union_.increment = settings;
    return {RND_INCREMENT, union_, kDefaultMode};
}